

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O1

void __thiscall
QWidgetLineControl::draw
          (QWidgetLineControl *this,QPainter *painter,QPoint *offset,QRect *clip,int flags)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  QBrush *pQVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  QRectF local_98;
  undefined1 local_78 [8];
  undefined1 auStack_70 [24];
  undefined1 local_58 [24];
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.xp = 0.0;
  local_98.yp = 0.0;
  local_98.w = 0.0;
  if ((flags & 2U) == 0) goto LAB_0042cc2d;
  auStack_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  auStack_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)auStack_70);
  iVar6 = *(int *)(this + 0x110);
  iVar5 = *(int *)(this + 0x114) - iVar6;
  iVar3 = (int)this;
  if (iVar5 == 0 || *(int *)(this + 0x114) < iVar6) {
    if (((byte)this[0x51] & 2) != 0) {
      local_78._4_4_ = 1;
      local_78._0_4_ = *(undefined4 *)(this + 0x40);
      pQVar4 = (QBrush *)QPalette::brush(iVar3 + 0x30,Dark);
      QBrush::operator_cast_to_QVariant((QVariant *)local_58,pQVar4);
      QTextFormat::setProperty((int)auStack_70,(QVariant *)0x820);
      ::QVariant::~QVariant((QVariant *)local_58);
      goto LAB_0042cbd6;
    }
  }
  else {
    local_78._4_4_ = iVar5;
    local_78._0_4_ = iVar6;
    pQVar4 = (QBrush *)QPalette::brush(iVar3 + 0x30,Dark);
    QBrush::operator_cast_to_QVariant((QVariant *)local_58,pQVar4);
    QTextFormat::setProperty((int)auStack_70,(QVariant *)0x820);
    ::QVariant::~QVariant((QVariant *)local_58);
LAB_0042cbd6:
    pQVar4 = (QBrush *)QPalette::brush(iVar3 + 0x30,Dark);
    QBrush::operator_cast_to_QVariant((QVariant *)local_58,pQVar4);
    QTextFormat::setProperty((int)auStack_70,(QVariant *)0x821);
    ::QVariant::~QVariant((QVariant *)local_58);
  }
  QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::emplace<QTextLayout::FormatRange_const&>
            ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_98,(qsizetype)local_98.w,
             (FormatRange *)local_78);
  QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_98);
  QTextFormat::~QTextFormat((QTextFormat *)auStack_70);
LAB_0042cc2d:
  if ((flags & 1U) != 0) {
    local_78 = (undefined1  [8])(double)(*offset).xp.m_i;
    auStack_70._0_8_ = (undefined8)(*offset).yp.m_i;
    uVar1 = clip->x1;
    uVar2 = clip->y1;
    local_58._8_4_ = SUB84((double)(int)uVar2,0);
    local_58._0_8_ = (double)(int)uVar1;
    local_58._12_4_ = (int)((ulong)(double)(int)uVar2 >> 0x20);
    local_58._16_8_ = (undefined8)(((long)(clip->x2).m_i - (long)(int)uVar1) + 1);
    local_40 = (double)(((long)(clip->y2).m_i - (long)(int)uVar2) + 1);
    QTextLayout::draw((QPainter *)(this + 0x118),(QPointF *)painter,(QList_conflict *)local_78,
                      &local_98);
  }
  if (((flags & 4U) != 0) && ((*(ushort *)(this + 0x50) & 0x201) == 0x200)) {
    iVar6 = 0;
    if (*(int *)(this + 0x44) != -1) {
      iVar6 = *(int *)(this + 0x44);
    }
    local_58._8_8_ = (double)(*offset).yp.m_i;
    local_58._0_8_ = (double)(*offset).xp.m_i;
    QTextLayout::drawCursor
              ((QPainter *)(this + 0x118),(QPointF *)painter,(int)local_58,
               iVar6 + *(int *)(this + 0x40));
  }
  QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
            ((QArrayDataPointer<QTextLayout::FormatRange> *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::draw(QPainter *painter, const QPoint &offset, const QRect &clip, int flags)
{
    QList<QTextLayout::FormatRange> selections;
    if (flags & DrawSelections) {
        QTextLayout::FormatRange o;
        if (m_selstart < m_selend) {
            o.start = m_selstart;
            o.length = m_selend - m_selstart;
            o.format.setBackground(m_palette.brush(QPalette::Highlight));
            o.format.setForeground(m_palette.brush(QPalette::HighlightedText));
        } else {
            // mask selection
            if (m_blinkStatus){
                o.start = m_cursor;
                o.length = 1;
                o.format.setBackground(m_palette.brush(QPalette::Text));
                o.format.setForeground(m_palette.brush(QPalette::Window));
            }
        }
        selections.append(o);
    }

    if (flags & DrawText)
        textLayout()->draw(painter, offset, selections, clip);

    if (flags & DrawCursor){
        int cursor = m_cursor;
        if (m_preeditCursor != -1)
            cursor += m_preeditCursor;
        if (!m_hideCursor && m_blinkStatus)
            textLayout()->drawCursor(painter, offset, cursor, m_cursorWidth);
    }
}